

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O2

NFABaseState<unsigned_char,_int> * __thiscall
Centaurus::NFABaseState<unsigned_char,_int>::offset
          (NFABaseState<unsigned_char,_int> *__return_storage_ptr__,
          NFABaseState<unsigned_char,_int> *this,int value)

{
  pointer pNVar1;
  pointer this_00;
  NFATransition<unsigned_char> NStack_68;
  
  __return_storage_ptr__->_vptr_NFABaseState = (_func_int **)&PTR__NFABaseState_001937e0;
  (__return_storage_ptr__->m_transitions).
  super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->m_transitions).
  super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->m_transitions).
  super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pNVar1 = (this->m_transitions).
           super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->m_transitions).
                 super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pNVar1; this_00 = this_00 + 1
      ) {
    NFATransition<unsigned_char>::offset(&NStack_68,this_00,value);
    std::
    vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
    ::push_back(&__return_storage_ptr__->m_transitions,&NStack_68);
    NFATransition<unsigned_char>::~NFATransition(&NStack_68);
  }
  return __return_storage_ptr__;
}

Assistant:

NFABaseState<TCHAR, TLABEL> offset(int value) const
    {
        NFABaseState<TCHAR, TLABEL> new_state;

        for (const auto& transition : m_transitions)
        {
            new_state.add_transition(transition.offset(value));
        }

        return new_state;
    }